

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2094:24)>_>
::dispose(Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>_>
          *this)

{
  TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>
  *object;
  TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>
  *ptrCopy;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>_>
  *this_local;
  
  object = this->ptr;
  if (object != (TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>
                 *)0x0) {
    this->ptr = (TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2094:24)>
                 *)0x0;
    Disposer::
    dispose<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::TestCase2084::run()::__3>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }